

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_NearestNeighbors_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003a4220 == '\x01') {
    DAT_003a4220 = '\0';
    (*(code *)*_KNearestNeighborsClassifier_default_instance_)();
  }
  if (DAT_003a42a8 == '\x01') {
    DAT_003a42a8 = '\0';
    (*(code *)*_NearestNeighborsIndex_default_instance_)();
  }
  if (DAT_003a42e0 == '\x01') {
    DAT_003a42e0 = '\0';
    (*(code *)*_UniformWeighting_default_instance_)();
  }
  if (DAT_003a4300 == '\x01') {
    DAT_003a4300 = '\0';
    (*(code *)*_InverseDistanceWeighting_default_instance_)();
  }
  if (DAT_003a4320 == '\x01') {
    DAT_003a4320 = '\0';
    (*(code *)*_LinearIndex_default_instance_)();
  }
  if (DAT_003a4340 == '\x01') {
    DAT_003a4340 = '\0';
    (*(code *)*_SingleKdTreeIndex_default_instance_)();
  }
  if (DAT_003a4360 == '\x01') {
    DAT_003a4360 = 0;
    (*(code *)*_SquaredEuclideanDistance_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _KNearestNeighborsClassifier_default_instance_.Shutdown();
  _NearestNeighborsIndex_default_instance_.Shutdown();
  _UniformWeighting_default_instance_.Shutdown();
  _InverseDistanceWeighting_default_instance_.Shutdown();
  _LinearIndex_default_instance_.Shutdown();
  _SingleKdTreeIndex_default_instance_.Shutdown();
  _SquaredEuclideanDistance_default_instance_.Shutdown();
}